

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlibrary.cpp
# Opt level: O2

QObject * __thiscall QLibraryPrivate::pluginInstance(QLibraryPrivate *this)

{
  QMutex *this_00;
  QPointer<QObject> *this_01;
  Data *pDVar1;
  bool bVar2;
  QtPluginInstanceFunction p_Var3;
  QObject *ptr;
  long in_FS_OFFSET;
  undefined1 local_40 [8];
  undefined8 local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &this->mutex;
  local_38._0_1_ = true;
  local_38._1_7_ = 0xaaaaaaaaaaaaaa;
  local_40 = (undefined1  [8])this_00;
  QBasicMutex::lock(&this_00->super_QBasicMutex);
  pDVar1 = (this->inst).wp.d;
  if ((pDVar1 == (Data *)0x0) || ((pDVar1->strongref)._q_value.super___atomic_base<int>._M_i == 0))
  {
    ptr = (QObject *)0x0;
  }
  else {
    ptr = (this->inst).wp.value;
  }
  QMutexLocker<QMutex>::~QMutexLocker((QMutexLocker<QMutex> *)local_40);
  if (ptr == (QObject *)0x0) {
    p_Var3 = (this->instanceFactory).super_QBasicAtomicPointer<QObject_*()>._q_value._M_b._M_p;
    if (p_Var3 == (QtPluginInstanceFunction)0x0) {
      p_Var3 = loadPlugin(this);
      if (p_Var3 == (QtPluginInstanceFunction)0x0) {
        ptr = (QObject *)0x0;
        goto LAB_00435665;
      }
    }
    this_01 = &this->inst;
    ptr = (*p_Var3)();
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    local_40 = (undefined1  [8])this_00;
    QBasicMutex::lock(&this_00->super_QBasicMutex);
    local_38._0_1_ = true;
    bVar2 = QPointer::operator_cast_to_bool((QPointer *)this_01);
    if (bVar2) {
      pDVar1 = (this_01->wp).d;
      if ((pDVar1 == (Data *)0x0) ||
         ((pDVar1->strongref)._q_value.super___atomic_base<int>._M_i == 0)) {
        ptr = (QObject *)0x0;
      }
      else {
        ptr = (this->inst).wp.value;
      }
    }
    else {
      QWeakPointer<QObject>::assign<QObject>(&this_01->wp,ptr);
    }
    QMutexLocker<QMutex>::~QMutexLocker((QMutexLocker<QMutex> *)local_40);
  }
LAB_00435665:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return ptr;
  }
  __stack_chk_fail();
}

Assistant:

QObject *QLibraryPrivate::pluginInstance()
{
    // first, check if the instance is cached and hasn't been deleted
    QObject *obj = [&](){ QMutexLocker locker(&mutex); return inst.data(); }();
    if (obj)
        return obj;

    // We need to call the plugin's factory function. Is that cached?
    // skip increasing the reference count (why? -Thiago)
    QtPluginInstanceFunction factory = instanceFactory.loadAcquire();
    if (!factory)
        factory = loadPlugin();

    if (!factory)
        return nullptr;

    obj = factory();

    // cache again
    QMutexLocker locker(&mutex);
    if (inst)
        obj = inst;
    else
        inst = obj;
    return obj;
}